

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_takeImportedUnitsByName_Test::TestBody(Model_takeImportedUnitsByName_Test *this)

{
  char *pcVar1;
  unsigned_long local_68;
  unsigned_long local_60;
  AssertionResult gtest_ar;
  ModelPtr model;
  UnitsPtr takeUnits2;
  UnitsPtr takeUnits1;
  
  commonSetupImportedUnits();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"myImportedUnits",(allocator<char> *)&takeUnits2);
  libcellml::Model::takeUnits((string *)&takeUnits1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"myConcreteUnits",(allocator<char> *)&local_68);
  libcellml::Model::takeUnits((string *)&takeUnits2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_68 = 0;
  local_60 = libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","model->unitsCount()",&local_68,&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x36f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&takeUnits2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&takeUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Model, takeImportedUnitsByName)
{
    auto model = commonSetupImportedUnits();

    auto takeUnits1 = model->takeUnits("myImportedUnits");
    auto takeUnits2 = model->takeUnits("myConcreteUnits");

    EXPECT_EQ(size_t(0), model->unitsCount());
}